

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPSources::ProcessRTCPReportBlock
          (RTPSources *this,uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
          uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,uint32_t dlsr,RTPTime *receivetime,
          RTPAddress *senderaddress)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int32_t iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  bool bVar11;
  undefined3 uVar12;
  int iVar13;
  bool created;
  bool local_39;
  RTPInternalSourceData *local_38;
  
  iVar13 = GetRTCPSourceData(this,ssrc,senderaddress,&local_38,&local_39);
  if (-1 < iVar13) {
    iVar13 = 0;
    if (local_38 != (RTPInternalSourceData *)0x0) {
      bVar11 = (local_38->super_RTPSourceData).RRinf.hasinfo;
      uVar12 = *(undefined3 *)&(local_38->super_RTPSourceData).RRinf.field_0x1;
      uVar1 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.field_0x4;
      uVar2 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.fractionlost;
      uVar3 = *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRinf.fractionlost + 4);
      iVar7 = (local_38->super_RTPSourceData).RRinf.packetslost;
      uVar8 = (local_38->super_RTPSourceData).RRinf.exthighseqnr;
      uVar9 = (local_38->super_RTPSourceData).RRinf.jitter;
      uVar10 = (local_38->super_RTPSourceData).RRinf.lsr;
      uVar4 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.field_0x24;
      uVar5 = *(undefined4 *)&(local_38->super_RTPSourceData).RRinf.receivetime.m_t;
      uVar6 = *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRinf.receivetime.m_t + 4);
      (local_38->super_RTPSourceData).RRprevinf.dlsr = (local_38->super_RTPSourceData).RRinf.dlsr;
      *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.field_0x24 = uVar4;
      *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.receivetime.m_t = uVar5;
      *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRprevinf.receivetime.m_t + 4) = uVar6;
      (local_38->super_RTPSourceData).RRprevinf.packetslost = iVar7;
      (local_38->super_RTPSourceData).RRprevinf.exthighseqnr = uVar8;
      (local_38->super_RTPSourceData).RRprevinf.jitter = uVar9;
      (local_38->super_RTPSourceData).RRprevinf.lsr = uVar10;
      (local_38->super_RTPSourceData).RRprevinf.hasinfo = bVar11;
      *(undefined3 *)&(local_38->super_RTPSourceData).RRprevinf.field_0x1 = uVar12;
      *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.field_0x4 = uVar1;
      *(undefined4 *)&(local_38->super_RTPSourceData).RRprevinf.fractionlost = uVar2;
      *(undefined4 *)((long)&(local_38->super_RTPSourceData).RRprevinf.fractionlost + 4) = uVar3;
      (local_38->super_RTPSourceData).RRinf.fractionlost = (double)fractionlost * 0.00390625;
      (local_38->super_RTPSourceData).RRinf.packetslost = lostpackets;
      (local_38->super_RTPSourceData).RRinf.exthighseqnr = exthighseqnr;
      (local_38->super_RTPSourceData).RRinf.jitter = jitter;
      (local_38->super_RTPSourceData).RRinf.lsr = lsr;
      (local_38->super_RTPSourceData).RRinf.dlsr = dlsr;
      (local_38->super_RTPSourceData).RRinf.receivetime.m_t = receivetime->m_t;
      (local_38->super_RTPSourceData).RRinf.hasinfo = true;
      (local_38->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
      if (local_39 == true) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,local_38);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xc])(this,local_38);
      iVar13 = 0;
    }
  }
  return iVar13;
}

Assistant:

int RTPSources::ProcessRTCPReportBlock(uint32_t ssrc,uint8_t fractionlost,int32_t lostpackets,
                           uint32_t exthighseqnr,uint32_t jitter,uint32_t lsr,
			   uint32_t dlsr,const RTPTime &receivetime,const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;
	
	srcdat->ProcessReportBlock(fractionlost,lostpackets,exthighseqnr,jitter,lsr,dlsr,receivetime);

	// Call the callback
	if (created)
		OnNewSource(srcdat);

	OnRTCPReceiverReport(srcdat);
			
	return 0;
}